

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evolution-test.c++
# Opt level: O2

Orphan<capnp::DynamicValue> * __thiscall
capnp::compiler::anon_unknown_0::makeExampleValue
          (Orphan<capnp::DynamicValue> *__return_storage_ptr__,anon_unknown_0 *this,
          Orphanage orphanage,uint ordinal,Type type,uint sharedOrdinalCount)

{
  Type type_00;
  Field field_00;
  Field field_01;
  long lVar1;
  BuilderArena *this_00;
  CapTableBuilder *pCVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined2 uVar5;
  uint uVar6;
  EnumSchema EVar7;
  ulong uVar8;
  char *pcVar9;
  OrphanBuilder *this_01;
  undefined4 in_register_00000084;
  undefined4 in_register_0000008c;
  StringPtr name;
  Orphanage orphanage_00;
  Reader copyFrom;
  StringPtr name_00;
  Orphanage orphanage_01;
  ListSchema schema;
  Type TVar10;
  undefined8 in_stack_fffffffffffffd78;
  anon_union_8_2_eba6ea51_for_Type_5 in_stack_fffffffffffffd80;
  uint ordinal_local;
  Orphanage orphanage_local;
  StructSchema structType;
  Type type_local;
  Field field;
  undefined8 uStack_1d0;
  undefined1 local_1c8 [24];
  OrphanBuilder OStack_1b0;
  undefined4 uStack_18d;
  Orphan<capnp::DynamicList> result_1;
  Orphan<capnp::DynamicStruct> result;
  Builder builder;
  Enumerant local_68;
  
  type_local.field_4.scopeId._4_4_ = in_register_0000008c;
  type_local.field_4.scopeId._0_4_ = sharedOrdinalCount;
  type_local._4_4_ = in_register_00000084;
  type_local._0_4_ = ordinal;
  orphanage_local.capTable = (CapTableBuilder *)orphanage.arena;
  uVar5 = 0xe;
  if ((ordinal & 0xff0000) == 0) {
    uVar5 = (undefined2)ordinal;
  }
  orphanage_01.capTable._0_4_ = (uint)orphanage.capTable;
  ordinal_local = (uint)orphanage_01.capTable;
  orphanage_local.arena = (BuilderArena *)this;
  switch(uVar5) {
  case 1:
    __return_storage_ptr__->type = BOOL;
    (__return_storage_ptr__->field_1).boolValue = (bool)(~(byte)orphanage.capTable & 1);
    break;
  case 2:
    __return_storage_ptr__->type = INT;
    uVar8 = (ulong)(int)(((uint)orphanage_01.capTable & 0xff) - 0x80);
    goto LAB_0016c476;
  default:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[37]>
              ((Fault *)&field,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
               ,0x1ff,FAILED,(char *)0x0,"\"You added a new possible field type!\"",
               (char (*) [37])"You added a new possible field type!");
    kj::_::Debug::Fault::fatal((Fault *)&field);
  case 4:
    uVar6 = (uint)orphanage_01.capTable * 0xb8df;
    goto LAB_0016c45f;
  case 7:
    uVar6 = (uint)orphanage_01.capTable * 0xd;
LAB_0016c45f:
    uVar8 = (ulong)uVar6;
    __return_storage_ptr__->type = UINT;
LAB_0016c476:
    *(ulong *)&__return_storage_ptr__->field_1 = uVar8;
    break;
  case 0xb:
    __return_storage_ptr__->type = FLOAT;
    (__return_storage_ptr__->field_1).floatValue = (double)(uint)orphanage_01.capTable * 313.25;
    break;
  case 0xc:
    kj::str<unsigned_int&>
              ((String *)local_1c8,(kj *)&ordinal_local,(uint *)orphanage_local.capTable);
    lVar1 = CONCAT17(local_1c8[0xf],local_1c8._8_7_);
    if (lVar1 == 0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (char *)CONCAT17(local_1c8[7],local_1c8._0_7_);
    }
    copyFrom.super_StringPtr.content.size_ = lVar1 + (ulong)(lVar1 == 0);
    copyFrom.super_StringPtr.content.ptr = pcVar9;
    Orphanage::newOrphanCopy<capnp::Text::Reader>
              ((Orphan<capnp::Text> *)&field,&orphanage_local,copyFrom);
    Orphan<capnp::DynamicValue>::Orphan<capnp::Text>
              (__return_storage_ptr__,(Orphan<capnp::Text> *)&field);
    _::OrphanBuilder::~OrphanBuilder((OrphanBuilder *)&field);
    kj::Array<char>::~Array((Array<char> *)local_1c8);
    return __return_storage_ptr__;
  case 0xe:
    schema = Type::asList(&type_local);
    Orphanage::newOrphan(&result_1,&orphanage_local,schema,1);
    Orphan<capnp::DynamicList>::get((Builder *)&field,&result_1);
    TVar10.field_4.schema = in_stack_fffffffffffffd80.schema;
    TVar10.baseType = (short)in_stack_fffffffffffffd78;
    TVar10.listDepth = (char)((ulong)in_stack_fffffffffffffd78 >> 0x10);
    TVar10.isImplicitParam = (bool)(char)((ulong)in_stack_fffffffffffffd78 >> 0x18);
    TVar10.field_3 =
         (anon_union_2_2_d12d5221_for_Type_3)(short)((ulong)in_stack_fffffffffffffd78 >> 0x20);
    TVar10._6_2_ = (short)((ulong)in_stack_fffffffffffffd78 >> 0x30);
    orphanage_00.capTable._0_4_ = ordinal_local;
    orphanage_00.arena = (BuilderArena *)orphanage_local.capTable;
    orphanage_00.capTable._4_4_ = 0;
    makeExampleValue((Orphan<capnp::DynamicValue> *)local_1c8,
                     (anon_unknown_0 *)orphanage_local.arena,orphanage_00,schema.elementType._0_4_,
                     TVar10,schema.elementType.field_4._0_4_);
    DynamicList::Builder::adopt((Builder *)&field,0,(Orphan<capnp::DynamicValue> *)local_1c8);
    _::OrphanBuilder::~OrphanBuilder(&OStack_1b0);
    Orphan<capnp::DynamicValue>::Orphan<capnp::DynamicList>(__return_storage_ptr__,&result_1);
    this_01 = &result_1.builder;
    goto LAB_0016c657;
  case 0xf:
    EVar7 = Type::asEnum(&type_local);
    local_1c8._0_7_ = EVar7.super_Schema.raw._0_7_;
    local_1c8[7] = EVar7.super_Schema.raw._7_1_;
    EnumSchema::getEnumerants((EnumerantList *)&field,(EnumSchema *)local_1c8);
    EnumSchema::EnumerantList::operator[]
              (&local_68,(EnumerantList *)&field,
               (uint)orphanage_01.capTable % (uint)field.proto._reader.data);
    __return_storage_ptr__->type = ENUM;
    (__return_storage_ptr__->field_1).intValue = (int64_t)local_68.parent.super_Schema.raw;
    (__return_storage_ptr__->field_1).enumValue.value = local_68.ordinal;
    break;
  case 0x10:
    structType = Type::asStruct(&type_local);
    Orphanage::newOrphan(&result,&orphanage_local,structType);
    Orphan<capnp::DynamicStruct>::get(&builder,&result);
    name.content.size_ = 2;
    name.content.ptr = "i";
    StructSchema::findFieldByName((Maybe<capnp::StructSchema::Field> *)&field,&structType,name);
    if ((char)field.parent.super_Schema.raw == '\x01') {
      field_00.proto._reader.capTable._4_4_ = field.proto._reader.data._4_4_;
      field_00.proto._reader.capTable._0_4_ = (uint)field.proto._reader.data;
      stack0xfffffffffffffe6f = field.proto._reader.nestingLimit;
      uStack_18d = field.proto._reader._44_4_;
      OStack_1b0._15_8_ = field.proto._reader.pointers;
      OStack_1b0._23_8_ = field.proto._reader._32_8_;
      stack0xfffffffffffffe4f = field.proto._reader.capTable;
      local_1c8[7] = (undefined1)field.index;
      local_1c8._8_7_ = field._9_7_;
      local_1c8[0xf] = SUB81(field.proto._reader.segment,0);
      local_1c8._16_7_ = (undefined7)((ulong)field.proto._reader.segment >> 8);
      field.parent.super_Schema.raw._0_4_ = 4;
      field_00._8_8_ = field.proto._reader.segment;
      field_00.parent.super_Schema.raw = (Schema)(Schema)field._8_8_;
      field_00.proto._reader.segment = (SegmentReader *)field.proto._reader.capTable;
      field_00.proto._reader.data = field.proto._reader.pointers;
      field_00.proto._reader.pointers = (WirePointer *)field.proto._reader._32_8_;
      field_00.proto._reader.dataSize = field.proto._reader.nestingLimit;
      field_00.proto._reader.pointerCount = field.proto._reader._44_2_;
      field_00.proto._reader._38_2_ = field.proto._reader._46_2_;
      field_00.proto._reader._40_8_ = uStack_1d0;
      field._8_8_ = (ulong)(uint)orphanage_01.capTable;
      DynamicStruct::Builder::set(&builder,field_00,(Reader *)&field);
      DynamicValue::Reader::~Reader((Reader *)&field);
    }
    else {
      name_00.content.size_ = 3;
      name_00.content.ptr = "f0";
      StructSchema::getFieldByName(&field,&structType,name_00);
      uVar3 = field._8_8_;
      pCVar2 = orphanage_local.capTable;
      this_00 = orphanage_local.arena;
      field_01.parent.super_Schema.raw._4_4_ = field.parent.super_Schema.raw._4_4_;
      field_01.parent.super_Schema.raw._0_4_ = field.parent.super_Schema.raw._0_4_;
      field_01.proto._reader.data._4_4_ = field.proto._reader.data._4_4_;
      field_01.proto._reader.data._0_4_ = (uint)field.proto._reader.data;
      TVar10 = StructSchema::Field::getType(&field);
      type_00.field_4.schema = in_stack_fffffffffffffd80.schema;
      type_00.baseType = (short)in_stack_fffffffffffffd78;
      type_00.listDepth = (char)((ulong)in_stack_fffffffffffffd78 >> 0x10);
      type_00.isImplicitParam = (bool)(char)((ulong)in_stack_fffffffffffffd78 >> 0x18);
      type_00.field_3 =
           (anon_union_2_2_d12d5221_for_Type_3)(short)((ulong)in_stack_fffffffffffffd78 >> 0x20);
      type_00._6_2_ = (short)((ulong)in_stack_fffffffffffffd78 >> 0x30);
      orphanage_01.arena = (BuilderArena *)pCVar2;
      orphanage_01.capTable._4_4_ = 0;
      makeExampleValue((Orphan<capnp::DynamicValue> *)&result_1,(anon_unknown_0 *)this_00,
                       orphanage_01,TVar10._0_4_,type_00,TVar10.field_4._0_4_);
      uVar4 = field._8_8_;
      field.index = (uint)uVar3;
      field._12_4_ = SUB84(uVar3,4);
      field_01.index = field.index;
      field_01._12_4_ = field._12_4_;
      field_01.proto._reader.segment = field.proto._reader.segment;
      field_01.proto._reader.capTable = field.proto._reader.capTable;
      field_01.proto._reader.pointers = field.proto._reader.pointers;
      field_01.proto._reader.dataSize = field.proto._reader.dataSize;
      field_01.proto._reader.pointerCount = field.proto._reader.pointerCount;
      field_01.proto._reader._38_2_ = field.proto._reader._38_2_;
      field_01.proto._reader.nestingLimit = field.proto._reader.nestingLimit;
      field_01.proto._reader._44_4_ = field.proto._reader._44_4_;
      field._8_8_ = uVar4;
      DynamicStruct::Builder::adopt(&builder,field_01,(Orphan<capnp::DynamicValue> *)&result_1);
      _::OrphanBuilder::~OrphanBuilder((OrphanBuilder *)&result_1.builder.segment);
    }
    Orphan<capnp::DynamicValue>::Orphan<capnp::DynamicStruct>(__return_storage_ptr__,&result);
    this_01 = &result.builder;
LAB_0016c657:
    _::OrphanBuilder::~OrphanBuilder(this_01);
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->builder).tag.content = 0;
  (__return_storage_ptr__->builder).segment = (SegmentBuilder *)0x0;
  (__return_storage_ptr__->builder).capTable = (CapTableBuilder *)0x0;
  (__return_storage_ptr__->builder).location = (word *)0x0;
  return __return_storage_ptr__;
}

Assistant:

Orphan<DynamicValue> makeExampleValue(
    Orphanage orphanage, uint ordinal, Type type, uint sharedOrdinalCount) {
  switch (type.which()) {
    case schema::Type::INT32: return ordinal * 47327;
    case schema::Type::FLOAT64: return ordinal * 313.25;
    case schema::Type::INT8: return int(ordinal % 256) - 128;
    case schema::Type::UINT16: return ordinal * 13;
    case schema::Type::BOOL: return ordinal % 2 == 0;
    case schema::Type::TEXT: return orphanage.newOrphanCopy(Text::Reader(kj::str(ordinal)));
    case schema::Type::STRUCT: {
      auto structType = type.asStruct();
      auto result = orphanage.newOrphan(structType);
      auto builder = result.get();

      KJ_IF_MAYBE(fieldI, structType.findFieldByName("i")) {
        // Type is "StructType"
        builder.set(*fieldI, ordinal);
      } else {
        // Type is "Int32Struct" or the like.
        auto field = structType.getFieldByName("f0");
        builder.adopt(field, makeExampleValue(
            orphanage, ordinal, field.getType(), sharedOrdinalCount));
      }

      return kj::mv(result);
    }
    case schema::Type::ENUM: {
      auto enumerants = type.asEnum().getEnumerants();
      return DynamicEnum(enumerants[ordinal %enumerants.size()]);
    }
    case schema::Type::LIST: {
      auto listType = type.asList();
      auto elementType = listType.getElementType();
      auto result = orphanage.newOrphan(listType, 1);
      result.get().adopt(0, makeExampleValue(
          orphanage, ordinal, elementType, sharedOrdinalCount));
      return kj::mv(result);
    }
    default:
      KJ_FAIL_ASSERT("You added a new possible field type!");
  }